

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

ssize_t __thiscall higan::HttpContext::ParseFirstLine(HttpContext *this,char *begin,char *end)

{
  bool bVar1;
  char local_49;
  char *local_48;
  char *url_end;
  char *local_38;
  char *method_end;
  char *first_line_end;
  char *end_local;
  char *begin_local;
  HttpContext *this_local;
  
  first_line_end = end;
  end_local = begin;
  begin_local = (char *)this;
  method_end = std::search<char_const*,char_const*>(begin,end,CRLF,CRLF + CRLF_LEN);
  if (method_end == first_line_end) {
    this_local = (HttpContext *)0x0;
  }
  else {
    url_end._7_1_ = 0x20;
    local_38 = std::find<char_const*,char>(end_local,method_end,(char *)((long)&url_end + 7));
    if (local_38 == method_end) {
      this_local = (HttpContext *)0xffffffffffffffff;
    }
    else {
      bVar1 = HttpRequest::SetMethod(&this->request_,end_local,local_38);
      if (bVar1) {
        local_49 = ' ';
        local_48 = std::find<char_const*,char>(local_38 + 1,method_end,&local_49);
        if (local_48 == method_end) {
          this_local = (HttpContext *)0xffffffffffffffff;
        }
        else {
          bVar1 = HttpRequest::SetUrl(&this->request_,local_38 + 1,local_48);
          if (bVar1) {
            if ((long)method_end - (long)local_48 == 9) {
              bVar1 = HttpRequest::SetVersion(&this->request_,local_48 + 1,method_end);
              if (bVar1) {
                this->status_ = PARSE_HEADERS;
                this_local = (HttpContext *)(method_end + (CRLF_LEN - (long)end_local));
              }
              else {
                this_local = (HttpContext *)0xffffffffffffffff;
              }
            }
            else {
              this_local = (HttpContext *)0xffffffffffffffff;
            }
          }
          else {
            this_local = (HttpContext *)0xffffffffffffffff;
          }
        }
      }
      else {
        this_local = (HttpContext *)0xffffffffffffffff;
      }
    }
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t HttpContext::ParseFirstLine(const char* begin, const char* end)
{
	// GET /hello.html HTTP/1.1\r\n

	const char* first_line_end = std::search(begin, end, CRLF, CRLF + CRLF_LEN);
	CHECK_IF_RETURN(first_line_end == end, true, 0);

	// GET
	const char* method_end = std::find(begin, first_line_end, ' ');
	CHECK_IF_RETURN(method_end == first_line_end, true, -1);
	CHECK_IF_RETURN(request_.SetMethod(begin, method_end), false, -1);


	// /hello.html
	const char* url_end = std::find(method_end + 1, first_line_end, ' ');
	CHECK_IF_RETURN(url_end == first_line_end, true, -1);
	CHECK_IF_RETURN(request_.SetUrl(method_end + 1, url_end), false, -1);


	CHECK_IF_RETURN(first_line_end - url_end != 9, true, -1);
	// HTTP/1.1
	CHECK_IF_RETURN(request_.SetVersion(url_end + 1, first_line_end), false, -1);


	status_ = PARSE_HEADERS;
	return first_line_end - begin + CRLF_LEN;
}